

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O0

int Dch_ObjCheckTfi_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  if (pObj == (Aig_Obj_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      if ((*(ulong *)&pObj->field_0x18 >> 4 & 1) == 0) {
        iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
        if (iVar1 == 0) {
          Aig_ObjSetTravIdCurrent(p,pObj);
          pAVar2 = Aig_ObjFanin0(pObj);
          iVar1 = Dch_ObjCheckTfi_rec(p,pAVar2);
          if (iVar1 == 0) {
            pAVar2 = Aig_ObjFanin1(pObj);
            iVar1 = Dch_ObjCheckTfi_rec(p,pAVar2);
            if (iVar1 == 0) {
              pAVar2 = Aig_ObjEquiv(p,pObj);
              p_local._4_4_ = Dch_ObjCheckTfi_rec(p,pAVar2);
            }
            else {
              p_local._4_4_ = 1;
            }
          }
          else {
            p_local._4_4_ = 1;
          }
        }
        else {
          p_local._4_4_ = 0;
        }
      }
      else {
        p_local._4_4_ = 1;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Dch_ObjCheckTfi_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    // check the trivial cases
    if ( pObj == NULL )
        return 0;
    if ( Aig_ObjIsCi(pObj) )
        return 0;
    if ( pObj->fMarkA )
        return 1;
    // skip the visited node
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return 0;
    Aig_ObjSetTravIdCurrent( p, pObj );
    // check the children
    if ( Dch_ObjCheckTfi_rec( p, Aig_ObjFanin0(pObj) ) )
        return 1;
    if ( Dch_ObjCheckTfi_rec( p, Aig_ObjFanin1(pObj) ) )
        return 1;
    // check equivalent nodes
    return Dch_ObjCheckTfi_rec( p, Aig_ObjEquiv(p, pObj) );
}